

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Homogeneous.h
# Opt level: O3

void __thiscall
Eigen::internal::
homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
          (homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
           *this,Matrix<float,_4,_1,_0,_4,_1> *dst)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  PointerType ptr;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pfVar3 = *(float **)this;
  pfVar4 = *(float **)(this + 8);
  fVar9 = *pfVar4;
  fVar1 = pfVar4[1];
  fVar2 = pfVar4[2];
  fVar6 = fVar2 * pfVar3[8] + fVar1 * pfVar3[4] + *pfVar3 * fVar9;
  fVar7 = fVar2 * pfVar3[9] + fVar1 * pfVar3[5] + pfVar3[1] * fVar9;
  fVar8 = fVar2 * pfVar3[10] + fVar1 * pfVar3[6] + pfVar3[2] * fVar9;
  fVar9 = fVar2 * pfVar3[0xb] + fVar1 * pfVar3[7] + pfVar3[3] * fVar9;
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[0] =
       fVar6;
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[1] =
       fVar7;
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2] =
       fVar8;
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
       fVar9;
  lVar5 = *(long *)this;
  if (((int)lVar5 + 0x30U & 0xf) == 0) {
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[0] =
         fVar6 + *(float *)(lVar5 + 0x30);
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[1] =
         fVar7 + *(float *)(lVar5 + 0x34);
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2] =
         fVar8 + *(float *)(lVar5 + 0x38);
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
         fVar9 + *(float *)(lVar5 + 0x3c);
    return;
  }
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CoreEvaluators.h"
                ,0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<float, 4, 4>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<float, 4, 4>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC void evalTo(Dest& dst) const
  {
    // FIXME investigate how to allow lazy evaluation of this product when possible
    dst = Block<const LhsMatrixTypeNested,
              LhsMatrixTypeNested::RowsAtCompileTime,
              LhsMatrixTypeNested::ColsAtCompileTime==Dynamic?Dynamic:LhsMatrixTypeNested::ColsAtCompileTime-1>
            (m_lhs,0,0,m_lhs.rows(),m_lhs.cols()-1) * m_rhs;
    dst += m_lhs.col(m_lhs.cols()-1).rowwise()
            .template replicate<MatrixType::ColsAtCompileTime>(m_rhs.cols());
  }